

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_splitter.cc
# Opt level: O2

void brotli::CopyCommandsToByteArray
               (Command *cmds,size_t num_commands,
               vector<unsigned_short,_std::allocator<unsigned_short>_> *insert_and_copy_codes,
               vector<unsigned_short,_std::allocator<unsigned_short>_> *distance_prefixes)

{
  uint16_t *__x;
  bool bVar1;
  
  __x = &cmds->cmd_prefix_;
  while (bVar1 = num_commands != 0, num_commands = num_commands - 1, bVar1) {
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::push_back
              (insert_and_copy_codes,__x);
    if ((*(uint32_t *)(__x + -8) != 0) && (0x7f < *__x)) {
      std::vector<unsigned_short,_std::allocator<unsigned_short>_>::push_back
                (distance_prefixes,__x + 1);
    }
    __x = __x + 0xc;
  }
  return;
}

Assistant:

void CopyCommandsToByteArray(const Command* cmds,
                             const size_t num_commands,
                             std::vector<uint16_t>* insert_and_copy_codes,
                             std::vector<uint16_t>* distance_prefixes) {
  for (size_t i = 0; i < num_commands; ++i) {
    const Command& cmd = cmds[i];
    insert_and_copy_codes->push_back(cmd.cmd_prefix_);
    if (cmd.copy_len_ > 0 && cmd.cmd_prefix_ >= 128) {
      distance_prefixes->push_back(cmd.dist_prefix_);
    }
  }
}